

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::DeformableConv2D_x86_avx512::forward
          (DeformableConv2D_x86_avx512 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  Mat *pMVar3;
  size_t _elemsize;
  _func_int *p_Var4;
  Mat *this_00;
  int *piVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  Option *pOVar10;
  int iVar11;
  long lVar12;
  uint _w;
  long lVar13;
  int iVar14;
  long lVar15;
  bool bVar16;
  int iVar17;
  uint _h;
  uint uVar18;
  long lVar19;
  float *pfVar20;
  bool bVar21;
  void *pvVar22;
  int iVar23;
  uint uVar24;
  bool bVar25;
  bool bVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ulong local_260;
  ulong local_258;
  Mat local_248;
  ulong local_200;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  Mat local_1e8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_198;
  ulong local_190;
  _func_int **local_188;
  pointer local_180;
  Mat local_178;
  Mat *local_130;
  Option *local_128;
  ulong local_120;
  ulong local_118;
  void *local_110;
  long local_108;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_100;
  _func_int **local_f8;
  pointer local_f0;
  void *local_e8;
  void *local_e0;
  DeformableConv2D_x86_avx512 *local_d8;
  _func_int **local_d0;
  Mat local_c8;
  Mat local_78;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_180 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  local_200 = (ulong)(uint)pMVar3->w;
  iVar1 = pMVar3->h;
  iVar2 = pMVar3->c;
  _elemsize = pMVar3->elemsize;
  p_Var4 = this->_vptr_DeformableConv2D_x86_avx512[-3];
  uVar8 = (long)(~((*(int *)(&this->field_0xd4 + (long)p_Var4) + -1) *
                  *(int *)(&this->field_0xdc + (long)p_Var4)) + pMVar3->w +
                 *(int *)(&this->field_0xec + (long)p_Var4) +
                *(int *)(&this->field_0xf0 + (long)p_Var4)) /
          (long)*(int *)(&this->field_0xe4 + (long)p_Var4);
  local_118 = uVar8 & 0xffffffff;
  iVar17 = (~((*(int *)(&this->field_0xd8 + (long)p_Var4) + -1) *
             *(int *)(&this->field_0xe0 + (long)p_Var4)) + iVar1 +
            *(int *)(&this->field_0xf4 + (long)p_Var4) + *(int *)(&this->field_0xf8 + (long)p_Var4))
           / *(int *)(&this->field_0xe8 + (long)p_Var4);
  _w = (int)uVar8 + 1;
  local_1e8.cstep = 0;
  local_1e8.data = (void *)0x0;
  local_1e8.refcount._0_4_ = 0;
  local_1e8.refcount._4_4_ = 0;
  local_1e8.elemsize._0_4_ = 0;
  local_1e8.elemsize._4_4_ = 0;
  local_1e8.elempack = 0;
  local_1e8.allocator = (Allocator *)0x0;
  local_1e8.dims = 0;
  local_1e8.w = 0;
  local_1e8.h = 0;
  local_1e8.d = 0;
  local_1e8.c = 0;
  p_Var4 = this->_vptr_DeformableConv2D_x86_avx512[-3];
  _h = iVar17 + 1;
  iVar23 = _h * _w;
  local_198 = top_blobs;
  local_100 = bottom_blobs;
  Mat::create(&local_1e8,
              iVar23 * iVar2 * *(int *)(&this->field_0xd8 + (long)p_Var4) *
              *(int *)(&this->field_0xd4 + (long)p_Var4),_elemsize,opt->blob_allocator);
  iVar14 = -100;
  if ((local_1e8.data != (void *)0x0) && ((long)local_1e8.c * local_1e8.cstep != 0)) {
    this_00 = (local_198->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_1f4 = iVar23;
    Mat::create(this_00,*(int *)(&this->field_0xd0 +
                                (long)this->_vptr_DeformableConv2D_x86_avx512[-3]),iVar23,_elemsize,
                opt->blob_allocator);
    if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
      iVar14 = iVar1 * (int)local_200;
      Mat::reshape(&local_78,pMVar3,iVar14 * iVar2,(Allocator *)0x0);
      local_130 = this_00;
      local_128 = opt;
      Mat::reshape(&local_c8,pMVar3 + 1,pMVar3[1].h * pMVar3[1].w * pMVar3[1].c,(Allocator *)0x0);
      if (-1 < iVar17) {
        local_180 = (pointer)((long)local_180 - (long)pMVar3);
        local_e0 = local_78.data;
        local_e8 = local_c8.data;
        iVar17 = (int)local_200;
        local_110 = local_1e8.data;
        local_1f0 = iVar17 + -1;
        local_190 = (ulong)_w;
        local_120 = (ulong)_h;
        local_188 = this->_vptr_DeformableConv2D_x86_avx512;
        local_260 = 0;
        do {
          if (-1 < (int)local_118) {
            local_108 = local_260 * local_190;
            local_f8 = this->_vptr_DeformableConv2D_x86_avx512;
            local_258 = 0;
            do {
              if (0 < *(int *)(&this->field_0xd8 + (long)local_188[-3])) {
                p_Var4 = local_188[-3];
                uVar18 = (uint)local_258;
                auVar9 = vpinsrd_avx(ZEXT416(uVar18),(int)local_260,1);
                auVar34 = vpinsrd_avx(ZEXT416(*(uint *)(&this->field_0xec + (long)p_Var4)),
                                      *(undefined4 *)(&this->field_0xf4 + (long)p_Var4),1);
                auVar28._8_8_ = 0;
                auVar28._0_8_ = *(ulong *)(&this->field_0xe4 + (long)p_Var4);
                auVar9 = vpmulld_avx(auVar28,auVar9);
                auVar9 = vpsubd_avx(auVar9,auVar34);
                pfVar20 = (float *)((long)local_1e8.data +
                                   (long)(int)(((int)local_108 + uVar18) * iVar2 *
                                               *(int *)(&this->field_0xd8 + (long)p_Var4) *
                                              *(int *)(&this->field_0xd4 + (long)p_Var4)) * 4);
                local_d0 = this->_vptr_DeformableConv2D_x86_avx512;
                iVar23 = 0;
                do {
                  iVar11 = *(int *)(&this->field_0xd4 + (long)local_f8[-3]);
                  if (0 < iVar11) {
                    local_f0 = (local_100->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                    uVar24 = 0;
                    do {
                      iVar11 = iVar11 * iVar23 + uVar24;
                      fVar27 = 1.0;
                      if (local_180 == (pointer)0xd8) {
                        fVar27 = *(float *)((long)local_f0[2].data +
                                           local_258 * 4 +
                                           (long)local_f0[2].w * local_260 * local_f0[2].elemsize +
                                           (long)iVar11 * local_f0[2].cstep * local_f0[2].elemsize);
                      }
                      auVar28 = vinsertps_avx(ZEXT416(*(uint *)((long)local_c8.data +
                                                               (long)(int)(((iVar11 * 2 + 1) * _h +
                                                                           (int)local_260) * _w +
                                                                          uVar18) * 4)),
                                              ZEXT416(*(uint *)((long)local_c8.data +
                                                               (long)(int)((iVar11 * 2 * _h +
                                                                           (int)local_260) * _w +
                                                                          uVar18) * 4)),0x10);
                      auVar34 = vpinsrd_avx(ZEXT416(uVar24),iVar23,1);
                      auVar31._8_8_ = 0;
                      auVar31._0_8_ = *(ulong *)(&this->field_0xdc + (long)local_d0[-3]);
                      auVar34 = vpmulld_avx(auVar31,auVar34);
                      auVar34 = vpaddd_avx(auVar9,auVar34);
                      auVar34 = vcvtdq2ps_avx(auVar34);
                      auVar29._0_4_ = auVar28._0_4_ + auVar34._0_4_;
                      auVar29._4_4_ = auVar28._4_4_ + auVar34._4_4_;
                      auVar29._8_4_ = auVar28._8_4_ + auVar34._8_4_;
                      auVar29._12_4_ = auVar28._12_4_ + auVar34._12_4_;
                      auVar34 = vmovshdup_avx(auVar29);
                      fVar30 = auVar34._0_4_;
                      if ((float)iVar17 <= auVar29._0_4_ ||
                          (((float)iVar1 <= fVar30 || auVar29._0_4_ <= -1.0) || fVar30 <= -1.0)) {
                        auVar28 = ZEXT416(0) << 0x20;
                        bVar26 = false;
                        auVar31 = ZEXT816(0) << 0x20;
                        auVar34 = (undefined1  [16])0x0;
                        bVar21 = false;
                        bVar16 = false;
                        bVar25 = false;
                        lVar15 = 0;
                        lVar12 = 0;
                        lVar13 = 0;
                        lVar19 = 0;
                        fVar35 = 0.0;
                      }
                      else {
                        auVar34 = vroundps_avx(auVar29,9);
                        auVar32._0_4_ = (uint)auVar34._0_4_;
                        auVar32._4_4_ = (uint)auVar34._4_4_;
                        auVar32._8_4_ = (int)auVar34._8_4_;
                        auVar32._12_4_ = (int)auVar34._12_4_;
                        auVar34 = vcvtdq2ps_avx(auVar32);
                        auVar28 = vsubps_avx(auVar29,auVar34);
                        auVar34 = vmovshdup_avx(auVar28);
                        fVar36 = auVar34._0_4_;
                        fVar33 = auVar28._0_4_;
                        bVar6 = (int)auVar32._0_4_ < local_1f0;
                        bVar21 = -1 < (int)auVar32._4_4_ && bVar6;
                        bVar7 = (int)auVar32._4_4_ < iVar1 + -1;
                        bVar16 = -1 < (int)auVar32._0_4_ && bVar7;
                        bVar25 = bVar7 && bVar6;
                        bVar26 = -1 < (int)(auVar32._4_4_ | auVar32._0_4_);
                        lVar15 = (long)(int)(iVar17 * auVar32._4_4_ + auVar32._0_4_);
                        if (!bVar26) {
                          lVar15 = 0;
                        }
                        lVar12 = (long)(int)(auVar32._0_4_ + iVar17 * auVar32._4_4_ + 1);
                        if (-1 >= (int)auVar32._4_4_ || !bVar6) {
                          lVar12 = 0;
                        }
                        iVar11 = (auVar32._4_4_ + 1) * iVar17;
                        lVar13 = (long)(int)(auVar32._0_4_ + iVar11);
                        if (-1 >= (int)auVar32._0_4_ || !bVar7) {
                          lVar13 = 0;
                        }
                        lVar19 = (long)(int)(iVar11 + auVar32._0_4_ + 1);
                        if (!bVar7 || !bVar6) {
                          lVar19 = 0;
                        }
                        fVar35 = (1.0 - fVar33) * (1.0 - fVar36);
                        auVar28 = ZEXT416((uint)(fVar33 * (1.0 - fVar36)));
                        auVar31 = ZEXT416((uint)(fVar36 * (1.0 - fVar33)));
                        auVar34 = ZEXT416((uint)(fVar33 * fVar36));
                      }
                      pvVar22 = local_78.data;
                      iVar11 = iVar2;
                      if (0 < iVar2) {
                        do {
                          auVar32 = ZEXT816(0) << 0x40;
                          if ((float)iVar17 > auVar29._0_4_ &&
                              (((float)iVar1 > fVar30 && auVar29._0_4_ > -1.0) && fVar30 > -1.0)) {
                            auVar37 = ZEXT816(0) << 0x40;
                            fVar33 = 0.0;
                            if (bVar26) {
                              fVar33 = *(float *)((long)pvVar22 + lVar15 * 4);
                            }
                            if (bVar21) {
                              auVar37 = ZEXT416(*(uint *)((long)pvVar22 + lVar12 * 4));
                            }
                            auVar38 = ZEXT816(0) << 0x40;
                            if (bVar16) {
                              auVar32 = ZEXT416(*(uint *)((long)pvVar22 + lVar13 * 4));
                            }
                            if (bVar25) {
                              auVar38 = ZEXT416(*(uint *)((long)pvVar22 + lVar19 * 4));
                            }
                            auVar37 = vfmadd213ss_fma(auVar37,auVar28,
                                                      ZEXT416((uint)(fVar33 * fVar35)));
                            auVar32 = vfmadd213ss_fma(auVar32,auVar31,auVar37);
                            auVar32 = vfmadd231ss_fma(auVar32,auVar34,auVar38);
                          }
                          *pfVar20 = auVar32._0_4_ * fVar27;
                          pfVar20 = pfVar20 + 1;
                          pvVar22 = (void *)((long)pvVar22 + (long)iVar14 * 4);
                          iVar11 = iVar11 + -1;
                        } while (iVar11 != 0);
                      }
                      uVar24 = uVar24 + 1;
                      iVar11 = *(int *)(&this->field_0xd4 + (long)local_d0[-3]);
                      local_1ec = iVar23;
                    } while ((int)uVar24 < iVar11);
                  }
                  iVar23 = iVar23 + 1;
                } while (iVar23 < *(int *)(&this->field_0xd8 + (long)local_f8[-3]));
              }
              local_258 = local_258 + 1;
            } while (local_258 != local_190);
          }
          local_260 = local_260 + 1;
          local_d8 = this;
        } while (local_260 != local_120);
      }
      Mat::reshape(&local_248,&local_1e8,
                   iVar2 * *(int *)(&this->field_0xd8 +
                                   (long)this->_vptr_DeformableConv2D_x86_avx512[-3]) *
                   *(int *)(&this->field_0xd4 + (long)this->_vptr_DeformableConv2D_x86_avx512[-3]),
                   local_1f4,(Allocator *)0x0);
      pOVar10 = local_128;
      pMVar3 = local_130;
      piVar5 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_1e8.allocator == (Allocator *)0x0) {
            if (local_1e8.data != (void *)0x0) {
              free(local_1e8.data);
            }
          }
          else {
            (*(local_1e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar5 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
      local_1e8.data = local_248.data;
      local_1e8.refcount._0_4_ = local_248.refcount._0_4_;
      local_1e8.refcount._4_4_ = local_248.refcount._4_4_;
      local_1e8.elemsize._0_4_ = (undefined4)local_248.elemsize;
      local_1e8.elemsize._4_4_ = local_248.elemsize._4_4_;
      local_1e8.elempack = local_248.elempack;
      local_1e8.allocator = local_248.allocator;
      local_1e8.dims = local_248.dims;
      local_1e8.w = local_248.w;
      local_1e8.h = local_248.h;
      local_1e8.d = local_248.d;
      local_1e8.c = local_248.c;
      local_1e8.cstep = local_248.cstep;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_248.allocator == (Allocator *)0x0) {
            if (local_248.data != (void *)0x0) {
              free(local_248.data);
            }
          }
          else {
            (*(local_248.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_248.cstep = 0;
      local_248.data = (void *)0x0;
      local_248.refcount._0_4_ = 0;
      local_248.refcount._4_4_ = 0;
      local_248.elemsize._0_4_ = 0;
      local_248.elemsize._4_4_ = 0;
      local_248.elempack = 0;
      local_248.dims = 0;
      local_248.w = 0;
      local_248.h = 0;
      local_248.d = 0;
      local_248.c = 0;
      (*this->inner_product->_vptr_Layer[7])(this->inner_product,&local_1e8,pMVar3,pOVar10);
      local_248.cstep = 0;
      local_248.data = (void *)0x0;
      local_248.refcount._0_4_ = 0;
      local_248.refcount._4_4_ = 0;
      local_248.elemsize._0_4_ = 0;
      local_248.elemsize._4_4_ = 0;
      local_248.elempack = 0;
      local_248.allocator = (Allocator *)0x0;
      local_248.dims = 0;
      local_248.w = 0;
      local_248.h = 0;
      local_248.d = 0;
      local_248.c = 0;
      (*this->permute->_vptr_Layer[7])(this->permute,pMVar3,&local_248,pOVar10);
      Mat::reshape(&local_178,&local_248,_w,_h,
                   *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86_avx512[-3]),
                   (Allocator *)0x0);
      piVar5 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_248.allocator == (Allocator *)0x0) {
            if (local_248.data != (void *)0x0) {
              free(local_248.data);
            }
          }
          else {
            (*(local_248.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar5 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
      local_248.data = local_178.data;
      local_248.refcount._0_4_ = local_178.refcount._0_4_;
      local_248.refcount._4_4_ = local_178.refcount._4_4_;
      local_248.elemsize._0_4_ = (undefined4)local_178.elemsize;
      local_248.elemsize._4_4_ = local_178.elemsize._4_4_;
      local_248.elempack = local_178.elempack;
      local_248.allocator = local_178.allocator;
      local_248.dims = local_178.dims;
      local_248.w = local_178.w;
      local_248.h = local_178.h;
      local_248.d = local_178.d;
      local_248.c = local_178.c;
      local_248.cstep = local_178.cstep;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_178.allocator == (Allocator *)0x0) {
            if (local_178.data != (void *)0x0) {
              free(local_178.data);
            }
          }
          else {
            (*(local_178.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_178.cstep = 0;
      local_178.data = (void *)0x0;
      local_178.refcount._0_4_ = 0;
      local_178.refcount._4_4_ = 0;
      local_178.elemsize._0_4_ = 0;
      local_178.elemsize._4_4_ = 0;
      local_178.elempack = 0;
      local_178.dims = 0;
      local_178.w = 0;
      local_178.h = 0;
      local_178.d = 0;
      local_178.c = 0;
      pMVar3 = (local_198->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pMVar3 != &local_248) {
        piVar5 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = pMVar3->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (pMVar3->allocator == (Allocator *)0x0) {
              if (pMVar3->data != (void *)0x0) {
                free(pMVar3->data);
              }
            }
            else {
              (*pMVar3->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar3->cstep = 0;
        pMVar3->data = (void *)0x0;
        pMVar3->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar3->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar3->elemsize + 4) = 0;
        pMVar3->dims = 0;
        pMVar3->w = 0;
        pMVar3->h = 0;
        pMVar3->d = 0;
        pMVar3->c = 0;
        pMVar3->data = local_248.data;
        pMVar3->refcount = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
        pMVar3->elemsize = CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize);
        pMVar3->elempack = local_248.elempack;
        pMVar3->allocator = local_248.allocator;
        pMVar3->dims = local_248.dims;
        pMVar3->w = local_248.w;
        pMVar3->h = local_248.h;
        pMVar3->d = local_248.d;
        pMVar3->c = local_248.c;
        pMVar3->cstep = local_248.cstep;
      }
      piVar5 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_248.allocator == (Allocator *)0x0) {
            if (local_248.data != (void *)0x0) {
              free(local_248.data);
            }
          }
          else {
            (*(local_248.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_248.cstep = 0;
      local_248.data = (void *)0x0;
      local_248.refcount._0_4_ = 0;
      local_248.refcount._4_4_ = 0;
      local_248.elemsize._0_4_ = 0;
      local_248.elemsize._4_4_ = 0;
      local_248.elempack = 0;
      local_248.dims = 0;
      local_248.w = 0;
      local_248.h = 0;
      local_248.d = 0;
      local_248.c = 0;
      if (local_c8.refcount != (int *)0x0) {
        LOCK();
        *local_c8.refcount = *local_c8.refcount + -1;
        UNLOCK();
        if (*local_c8.refcount == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            if (local_c8.data != (void *)0x0) {
              free(local_c8.data);
            }
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if (local_78.data != (void *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar14 = 0;
    }
  }
  piVar5 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_1e8.allocator == (Allocator *)0x0) {
        if (local_1e8.data != (void *)0x0) {
          free(local_1e8.data);
        }
      }
      else {
        (*(local_1e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar14;
}

Assistant:

int DeformableConv2D_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& offset = bottom_blobs[1];

    const bool has_mask = (bottom_blobs.size() == 3);

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int in_c = bottom_blob.c;
    const size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int out_w = (w + pad_left + pad_right - kernel_extent_w) / stride_w + 1;
    const int out_h = (h + pad_top + pad_bottom - kernel_extent_h) / stride_h + 1;

    // output = im2col matmul weight_t, im2col.shape is [out_h * out_w, kernel_h * kernel_w * in_c] (in python),
    // weight_t.shape is [num_output, kernel_h * kernel_w * in_c] (in python),
    // output.shape   is [out_h * out_w, num_output] (in python).
    Mat im2col;
    im2col.create(kernel_h * kernel_w * in_c * out_h * out_w, elemsize, opt.blob_allocator);
    if (im2col.empty())
        return -100;

    Mat& output = top_blobs[0];
    output.create(num_output, out_h * out_w, elemsize, opt.blob_allocator);
    if (output.empty())
        return -100;

    Mat bottom_blob_flatten = bottom_blob.reshape(w * h * in_c);
    Mat offset_flatten = offset.reshape(offset.w * offset.h * offset.c);
    const float* data_im_ptr = bottom_blob_flatten;
    const float* data_offset_ptr = offset_flatten;
    float* im2col_ptr = im2col;

    // im2col
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int h_col = 0; h_col < out_h; h_col++)
    {
        for (int w_col = 0; w_col < out_w; w_col++)
        {
            int h_in = h_col * stride_h - pad_top;
            int w_in = w_col * stride_w - pad_left;
            float* data_col_ptr = im2col_ptr + (h_col * out_w + w_col) * kernel_h * kernel_w * in_c;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    const int data_offset_h_ptr = (((i * kernel_w + j) * 2) * out_h + h_col) * out_w + w_col;
                    const int data_offset_w_ptr = (((i * kernel_w + j) * 2 + 1) * out_h + h_col) * out_w + w_col;

                    const float offset_h = data_offset_ptr[data_offset_h_ptr];
                    const float offset_w = data_offset_ptr[data_offset_w_ptr];
                    const float mask_ = has_mask ? bottom_blobs[2].channel(i * kernel_w + j).row(h_col)[w_col] : 1.f;
                    const float h_im = h_in + i * dilation_h + offset_h;
                    const float w_im = w_in + j * dilation_w + offset_w;

                    // Bilinear
                    const bool cond = h_im > -1 && w_im > -1 && h_im < h && w_im < w;
                    float w1 = 0.f;
                    float w2 = 0.f;
                    float w3 = 0.f;
                    float w4 = 0.f;
                    bool v1_cond = false;
                    bool v2_cond = false;
                    bool v3_cond = false;
                    bool v4_cond = false;
                    int v1_pos = 0;
                    int v2_pos = 0;
                    int v3_pos = 0;
                    int v4_pos = 0;
                    if (cond)
                    {
                        int h_low = floor(h_im);
                        int w_low = floor(w_im);
                        int h_high = h_low + 1;
                        int w_high = w_low + 1;

                        float lh = h_im - h_low;
                        float lw = w_im - w_low;
                        float hh = 1 - lh;
                        float hw = 1 - lw;

                        v1_cond = (h_low >= 0 && w_low >= 0);
                        v2_cond = (h_low >= 0 && w_high <= w - 1);
                        v3_cond = (h_high <= h - 1 && w_low >= 0);
                        v4_cond = (h_high <= h - 1 && w_high <= w - 1);
                        if (v1_cond)
                            v1_pos = h_low * w + w_low;
                        if (v2_cond)
                            v2_pos = h_low * w + w_high;
                        if (v3_cond)
                            v3_pos = h_high * w + w_low;
                        if (v4_cond)
                            v4_pos = h_high * w + w_high;

                        w1 = hh * hw;
                        w2 = hh * lw;
                        w3 = lh * hw;
                        w4 = lh * lw;
                    }

                    const float* data_im_channel_ptr = data_im_ptr;
                    for (int c_im = 0; c_im < in_c; c_im++)
                    {
                        float val = 0.f;
                        if (cond)
                        {
                            float v1 = v1_cond ? data_im_channel_ptr[v1_pos] : 0.f;
                            float v2 = v2_cond ? data_im_channel_ptr[v2_pos] : 0.f;
                            float v3 = v3_cond ? data_im_channel_ptr[v3_pos] : 0.f;
                            float v4 = v4_cond ? data_im_channel_ptr[v4_pos] : 0.f;
                            val = w1 * v1 + w2 * v2 + w3 * v3 + w4 * v4;
                        }
                        *data_col_ptr = val * mask_;
                        data_col_ptr += 1;
                        data_im_channel_ptr += h * w;
                    }
                }
            }
        }
    }
    im2col = im2col.reshape(kernel_h * kernel_w * in_c, out_h * out_w);
    // call InnerProduct
    inner_product->forward(im2col, output, opt);
    ncnn::Mat output_t;
    // call Permute
    permute->forward(output, output_t, opt);
    output_t = output_t.reshape(out_w, out_h, num_output);
    top_blobs[0] = output_t;
    return 0;
}